

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

iterator * __thiscall
slang::IntervalMap<int,_Foo_*,_0U>::end
          (iterator *__return_storage_ptr__,IntervalMap<int,_Foo_*,_0U> *this)

{
  (__return_storage_ptr__->super_const_iterator).map = this;
  (__return_storage_ptr__->super_const_iterator).path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
       (pointer)(__return_storage_ptr__->super_const_iterator).path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement;
  (__return_storage_ptr__->super_const_iterator).path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
  (__return_storage_ptr__->super_const_iterator).path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
  const_iterator::setToEnd(&__return_storage_ptr__->super_const_iterator);
  return __return_storage_ptr__;
}

Assistant:

iterator end() {
        iterator it(*this);
        it.setToEnd();
        return it;
    }